

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void liblogger::LogManager::Add(shared_ptr<liblogger::ILogger> *Log)

{
  LogManagerScopedLock lock;
  LogManagerScopedLock *in_stack_ffffffffffffffe0;
  value_type *in_stack_ffffffffffffffe8;
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
  *in_stack_fffffffffffffff0;
  
  LogManagerScopedLock::LogManagerScopedLock(in_stack_ffffffffffffffe0);
  std::__cxx11::
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>::
  push_back(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  LogManagerScopedLock::Unlock((LogManagerScopedLock *)0x1a3613);
  LogManagerScopedLock::~LogManagerScopedLock((LogManagerScopedLock *)0x1a361f);
  return;
}

Assistant:

void LogManager::Add(std::shared_ptr<ILogger> Log)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	m_loggers.push_back(Log);
	lock.Unlock();
#ifdef DEBUG
	std::string str = Log->GetName();
	Logger(LOGGER_DEBUG, "Added Logger: %s", str.c_str());
#endif
}